

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void safe_fprintf(FILE_conflict *f,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *__s;
  size_t sVar7;
  undefined8 in_RCX;
  ulong uVar8;
  undefined8 in_RDX;
  ulong buffsize;
  undefined8 in_R8;
  undefined8 in_R9;
  char *__s_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  wchar_t wc;
  char *local_318;
  FILE *local_310;
  va_list ap;
  char outbuff [256];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char fmtbuff_stack [256];
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  ap[0].gp_offset = 0x10;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  local_310 = (FILE *)f;
  ap[0].reg_save_area = local_1e8;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  uVar3 = vsnprintf(fmtbuff_stack,0x100,fmt,ap);
  uVar4 = 0x100;
  __s = (char *)0x0;
  __s_00 = fmtbuff_stack;
  while (uVar8 = (ulong)(-1 < (int)uVar3), local_318 = __s,
        -1 >= (int)uVar3 || (int)uVar4 <= (int)uVar3) {
    if ((int)uVar3 < (int)uVar4) {
      if ((int)uVar4 < 0x2000) {
        uVar4 = uVar4 * 2;
      }
      else {
        if (999999 < uVar4) {
          __s[uVar4 - 1] = '\0';
          uVar3 = uVar4;
          break;
        }
        uVar4 = uVar4 + (uVar4 >> 2);
      }
    }
    else {
      uVar4 = uVar3 + 1;
    }
    free(__s);
    __s = (char *)malloc((ulong)uVar4);
    if (__s == (char *)0x0) {
      local_318 = (char *)0x0;
      __s_00 = fmtbuff_stack;
      uVar3 = 0xff;
      break;
    }
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x10;
    ap[0].fp_offset = 0x30;
    ap[0].reg_save_area = local_1e8;
    uVar3 = vsnprintf(__s,(ulong)uVar4,fmt,ap);
    __s_00 = __s;
  }
  buffsize = 0;
  iVar5 = mbtowc((wchar_t *)0x0,(char *)0x0,1);
  if (iVar5 != -1) {
    bVar1 = true;
    while( true ) {
      cVar2 = *__s_00;
      if (cVar2 == '\0') break;
      if (bVar1) {
        iVar5 = mbtowc(&wc,__s_00,(long)(int)uVar3);
        if (iVar5 == -1) {
          cVar2 = *__s_00;
          goto LAB_0010dfa0;
        }
        uVar3 = uVar3 - iVar5;
        iVar6 = iswprint(wc);
        if ((iVar6 == 0) || (wc == L'\\')) {
          for (; 0 < iVar5; iVar5 = iVar5 + -1) {
            cVar2 = *__s_00;
            __s_00 = __s_00 + 1;
            sVar7 = bsdtar_expand_char(outbuff,buffsize,(ulong)(uint)(int)cVar2,(char)uVar8);
            buffsize = (ulong)(uint)((int)sVar7 + (int)buffsize);
          }
        }
        else {
          for (; 0 < iVar5; iVar5 = iVar5 + -1) {
            cVar2 = *__s_00;
            __s_00 = __s_00 + 1;
            outbuff[buffsize] = cVar2;
            buffsize = buffsize + 1;
          }
          buffsize = buffsize & 0xffffffff;
        }
      }
      else {
LAB_0010dfa0:
        __s_00 = __s_00 + 1;
        sVar7 = bsdtar_expand_char(outbuff,buffsize,(ulong)(uint)(int)cVar2,(char)uVar8);
        buffsize = (ulong)(uint)((int)buffsize + (int)sVar7);
        bVar1 = false;
      }
      if (0x80 < (uint)buffsize) {
        outbuff[buffsize] = '\0';
        fputs(outbuff,local_310);
        buffsize = 0;
      }
    }
    outbuff[buffsize] = '\0';
    fputs(outbuff,local_310);
  }
  free(local_318);
  return;
}

Assistant:

void
safe_fprintf(FILE *f, const char *fmt, ...)
{
	char fmtbuff_stack[256]; /* Place to format the printf() string. */
	char outbuff[256]; /* Buffer for outgoing characters. */
	char *fmtbuff_heap; /* If fmtbuff_stack is too small, we use malloc */
	char *fmtbuff;  /* Pointer to fmtbuff_stack or fmtbuff_heap. */
	int fmtbuff_length;
	int length, n;
	va_list ap;
	const char *p;
	unsigned i;
	wchar_t wc;
	char try_wc;

	/* Use a stack-allocated buffer if we can, for speed and safety. */
	fmtbuff_heap = NULL;
	fmtbuff_length = sizeof(fmtbuff_stack);
	fmtbuff = fmtbuff_stack;

	/* Try formatting into the stack buffer. */
	va_start(ap, fmt);
	length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
	va_end(ap);

	/* If the result was too large, allocate a buffer on the heap. */
	while (length < 0 || length >= fmtbuff_length) {
		if (length >= fmtbuff_length)
			fmtbuff_length = length+1;
		else if (fmtbuff_length < 8192)
			fmtbuff_length *= 2;
		else if (fmtbuff_length < 1000000)
			fmtbuff_length += fmtbuff_length / 4;
		else {
			length = fmtbuff_length;
			fmtbuff_heap[length-1] = '\0';
			break;
		}
		free(fmtbuff_heap);
		fmtbuff_heap = malloc(fmtbuff_length);

		/* Reformat the result into the heap buffer if we can. */
		if (fmtbuff_heap != NULL) {
			fmtbuff = fmtbuff_heap;
			va_start(ap, fmt);
			length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
			va_end(ap);
		} else {
			/* Leave fmtbuff pointing to the truncated
			 * string in fmtbuff_stack. */
			fmtbuff = fmtbuff_stack;
			length = sizeof(fmtbuff_stack) - 1;
			break;
		}
	}

	/* Note: mbrtowc() has a cleaner API, but mbtowc() seems a bit
	 * more portable, so we use that here instead. */
	if (mbtowc(NULL, NULL, 1) == -1) { /* Reset the shift state. */
		/* mbtowc() should never fail in practice, but
		 * handle the theoretical error anyway. */
		free(fmtbuff_heap);
		return;
	}

	/* Write data, expanding unprintable characters. */
	p = fmtbuff;
	i = 0;
	try_wc = 1;
	while (*p != '\0') {

		/* Convert to wide char, test if the wide
		 * char is printable in the current locale. */
		if (try_wc && (n = mbtowc(&wc, p, length)) != -1) {
			length -= n;
			if (iswprint(wc) && wc != L'\\') {
				/* Printable, copy the bytes through. */
				while (n-- > 0)
					outbuff[i++] = *p++;
			} else {
				/* Not printable, format the bytes. */
				while (n-- > 0)
					i += (unsigned)bsdtar_expand_char(
					    outbuff, sizeof(outbuff), i, *p++);
			}
		} else {
			/* After any conversion failure, don't bother
			 * trying to convert the rest. */
			i += (unsigned)bsdtar_expand_char(outbuff, sizeof(outbuff), i, *p++);
			try_wc = 0;
		}

		/* If our output buffer is full, dump it and keep going. */
		if (i > (sizeof(outbuff) - 128)) {
			outbuff[i] = '\0';
			fprintf(f, "%s", outbuff);
			i = 0;
		}
	}
	outbuff[i] = '\0';
	fprintf(f, "%s", outbuff);

	/* If we allocated a heap-based formatting buffer, free it now. */
	free(fmtbuff_heap);
}